

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.c
# Opt level: O0

char * unparse_token(Token *t,char *buf)

{
  char *buf_local;
  Token *t_local;
  
  switch(t->type) {
  case TOK_DOLLAR_DATA_REGISTER:
    sprintf(buf,"$%d.d%s",(ulong)(t->u).reginfo.which,
            unparse_token::regdesc[(t->u).reginfo.sgnd][(t->u).reginfo.size]);
    break;
  case TOK_DOLLAR_ADDRESS_REGISTER:
    sprintf(buf,"$%d.a%s",(ulong)(t->u).reginfo.which,
            unparse_token::regdesc[(t->u).reginfo.sgnd][(t->u).reginfo.size]);
    break;
  case TOK_DOLLAR_GENERAL_REGISTER:
    sprintf(buf,"$%d.g%s",(ulong)(t->u).reginfo.which,
            unparse_token::regdesc[(t->u).reginfo.sgnd][(t->u).reginfo.size]);
    break;
  case TOK_DOLLAR_AMODE:
    sprintf(buf,"$%d.m%s",(ulong)(t->u).reginfo.which,
            unparse_token::regdesc[(t->u).reginfo.sgnd][(t->u).reginfo.size]);
    break;
  case TOK_DOLLAR_REVERSED_AMODE:
    sprintf(buf,"$%d.r%s",(ulong)(t->u).reginfo.which,
            unparse_token::regdesc[(t->u).reginfo.sgnd][(t->u).reginfo.size]);
    break;
  case TOK_DOLLAR_NUMBER:
    sprintf(buf,"$%d.%s",(ulong)(t->u).reginfo.which,
            unparse_token::regdesc[(t->u).reginfo.sgnd][(t->u).reginfo.size]);
    break;
  case TOK_DOLLAR_AMODE_PTR:
    sprintf(buf,"$%d.p%s",(ulong)(t->u).reginfo.which,
            unparse_token::regdesc[(t->u).reginfo.sgnd][(t->u).reginfo.size]);
    break;
  case TOK_DOLLAR_REVERSED_AMODE_PTR:
    sprintf(buf,"$%d.q%s",(ulong)(t->u).reginfo.which,
            unparse_token::regdesc[(t->u).reginfo.sgnd][(t->u).reginfo.size]);
    break;
  default:
    strcpy(buf,(t->u).string);
    break;
  case TOK_QUOTED_STRING:
    sprintf(buf,"\"%s\"",(t->u).string);
    break;
  case TOK_NUMBER:
    sprintf(buf,"%ld",(t->u).string);
    break;
  case TOK_DATA_REGISTER:
    sprintf(buf,"d%d.%s",(ulong)(t->u).reginfo.which,
            unparse_token::regdesc[(t->u).reginfo.sgnd][(t->u).reginfo.size]);
    break;
  case TOK_ADDRESS_REGISTER:
    sprintf(buf,"a%d.%s",(ulong)(t->u).reginfo.which,
            unparse_token::regdesc[(t->u).reginfo.sgnd][(t->u).reginfo.size]);
    break;
  case TOK_TEMP_REGISTER:
    sprintf(buf,"tmp%d.%s",(ulong)(t->u).reginfo.which,
            unparse_token::regdesc[(t->u).reginfo.sgnd][(t->u).reginfo.size]);
    break;
  case TOK_DEREF:
    if ((t->u).reginfo.size == '\0') {
      strcpy(buf,"deref");
    }
    else {
      sprintf(buf,"deref%s",unparse_token::regdesc[(t->u).reginfo.sgnd][(t->u).reginfo.size]);
    }
    break;
  case TOK_SWAP:
    sprintf(buf,"swap%s",unparse_token::regdesc[(t->u).reginfo.sgnd][(t->u).reginfo.size]);
    break;
  case TOK_EMPTY:
    strcpy(buf,"[EMPTY]");
  }
  return buf;
}

Assistant:

char *
unparse_token (const Token *t, char *buf)
{
  static const char *regdesc[2][5] = {
    { "", "ub", "uw",  "", "ul" },
    { "", "sb", "sw",  "", "sl" }
  };

  switch (t->type) {
  case TOK_NUMBER:
    sprintf (buf, "%ld", t->u.n);
    break;
  case TOK_QUOTED_STRING:
    sprintf (buf, "\"%s\"", t->u.string);
    break;
  case TOK_EMPTY:
    strcpy (buf, "[EMPTY]");
    break;
  case TOK_DEREF:
    if (t->u.derefinfo.size == 0)
      strcpy (buf, "deref");
    else sprintf (buf, "deref%s",
		  regdesc[t->u.derefinfo.sgnd][t->u.derefinfo.size]);
    break;
  case TOK_SWAP:
    sprintf (buf, "swap%s", regdesc[t->u.derefinfo.sgnd][t->u.derefinfo.size]);
    break;
  case TOK_DATA_REGISTER:
    sprintf (buf, "d%d.%s", t->u.reginfo.which,
	     regdesc[t->u.reginfo.sgnd][t->u.reginfo.size]);
    break;
  case TOK_ADDRESS_REGISTER:
    sprintf (buf, "a%d.%s", t->u.reginfo.which,
	     regdesc[t->u.reginfo.sgnd][t->u.reginfo.size]);
    break;
  case TOK_TEMP_REGISTER:
    sprintf (buf, "tmp%d.%s", t->u.reginfo.which,
	     regdesc[t->u.reginfo.sgnd][t->u.reginfo.size]);
    break;
  case TOK_DOLLAR_DATA_REGISTER:
    sprintf (buf, "$%d.d%s", t->u.dollarinfo.which,
	     regdesc[t->u.dollarinfo.sgnd][t->u.dollarinfo.size]);
    break;
  case TOK_DOLLAR_ADDRESS_REGISTER:
    sprintf (buf, "$%d.a%s", t->u.dollarinfo.which,
	     regdesc[t->u.dollarinfo.sgnd][t->u.dollarinfo.size]);
    break;
  case TOK_DOLLAR_GENERAL_REGISTER:
    sprintf (buf, "$%d.g%s", t->u.dollarinfo.which,
	     regdesc[t->u.dollarinfo.sgnd][t->u.dollarinfo.size]);
    break;
  case TOK_DOLLAR_AMODE:
    sprintf (buf, "$%d.m%s", t->u.dollarinfo.which,
	     regdesc[t->u.dollarinfo.sgnd][t->u.dollarinfo.size]);
    break;
  case TOK_DOLLAR_REVERSED_AMODE:
    sprintf (buf, "$%d.r%s", t->u.dollarinfo.which,
	     regdesc[t->u.dollarinfo.sgnd][t->u.dollarinfo.size]);
    break;
  case TOK_DOLLAR_AMODE_PTR:
    sprintf (buf, "$%d.p%s", t->u.dollarinfo.which,
	     regdesc[t->u.dollarinfo.sgnd][t->u.dollarinfo.size]);
    break;
  case TOK_DOLLAR_REVERSED_AMODE_PTR:
    sprintf (buf, "$%d.q%s", t->u.dollarinfo.which,
	     regdesc[t->u.dollarinfo.sgnd][t->u.dollarinfo.size]);
    break;
  case TOK_DOLLAR_NUMBER:
    sprintf (buf, "$%d.%s", t->u.dollarinfo.which,
	     regdesc[t->u.dollarinfo.sgnd][t->u.dollarinfo.size]);
    break;
  default:
    strcpy (buf, t->u.string);
    break;
  }

  return buf;
}